

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stringOps.cpp
# Opt level: O0

string * gmlc::utilities::stringOps::getTailString_any_abi_cxx11_(string_view input,string_view sep)

{
  basic_string_view<char,_std::char_traits<char>_> __str;
  size_type sVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RCX;
  allocator<char> *in_RDX;
  string *in_RDI;
  basic_string_view<char,_std::char_traits<char>_> bVar2;
  size_type sepLoc;
  string *ret;
  size_type in_stack_ffffffffffffff78;
  basic_string_view<char,_std::char_traits<char>_> *in_stack_ffffffffffffff80;
  size_t in_stack_ffffffffffffff88;
  string *__pos;
  basic_string_view<char,_std::char_traits<char>_> *in_stack_ffffffffffffffa0;
  undefined7 in_stack_ffffffffffffffb8;
  undefined1 uVar3;
  
  __str._M_str = (char *)in_RDI;
  __str._M_len = in_stack_ffffffffffffff88;
  __pos = in_RDI;
  sVar1 = std::basic_string_view<char,_std::char_traits<char>_>::find_last_of
                    (in_stack_ffffffffffffff80,__str,in_stack_ffffffffffffff78);
  uVar3 = 0;
  if (sVar1 != 0xffffffffffffffff) {
    bVar2 = std::basic_string_view<char,_std::char_traits<char>_>::substr
                      (in_stack_ffffffffffffffa0,(size_type)__pos,(size_type)in_RDI);
    in_RDX = (allocator<char> *)bVar2._M_str;
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::basic_string_view<char,std::char_traits<char>>,void>
            (in_RCX,(basic_string_view<char,_std::char_traits<char>_> *)
                    CONCAT17(uVar3,in_stack_ffffffffffffffb8),in_RDX);
  std::allocator<char>::~allocator((allocator<char> *)&stack0xffffffffffffffa7);
  return __pos;
}

Assistant:

std::string
        getTailString_any(std::string_view input, std::string_view sep) noexcept
    {
        auto sepLoc = input.find_last_of(sep);
        auto ret = std::string(
            (sepLoc == std::string::npos) ? input : input.substr(sepLoc + 1));
        return ret;
    }